

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

t_int * cos_perform(t_int *w)

{
  float fVar1;
  double dVar2;
  float *pfVar3;
  undefined8 local_60;
  tabfudge tf;
  int normhipart;
  double dphase;
  t_float frac;
  t_float f2;
  t_float f1;
  float *addr;
  float *tab;
  float *pfStack_20;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  pfVar3 = cos_table;
  out = (t_sample *)w[1];
  tab._4_4_ = (int)w[3];
  fVar1 = *out;
  pfStack_20 = (float *)w[2];
  while (dVar2 = (double)(fVar1 * 512.0) + 1572864.0, out = out + 1,
        _f2 = pfVar3 + (int)((uint)((ulong)dVar2 >> 0x20) & 0x1ff),
        local_60 = (double)CONCAT44(0x41380000,SUB84(dVar2,0)), tab._4_4_ = tab._4_4_ + -1,
        tab._4_4_ != 0) {
    fVar1 = *out;
    *pfStack_20 = (float)(local_60 - 1572864.0) * (_f2[1] - *_f2) + *_f2;
    pfStack_20 = pfStack_20 + 1;
  }
  *pfStack_20 = (float)(local_60 - 1572864.0) * (_f2[1] - *_f2) + *_f2;
  return w + 4;
}

Assistant:

static t_int *cos_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase;
    int normhipart;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

#if 0           /* this is the readable version of the code. */
    while (n--)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1           /* this is the same, unwrapped by hand. */
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
        tf.tf_d = dphase;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
    while (--n)
    {
        dphase = (double)(*in++ * (float)(COSTABSIZE)) + UNITBIT32;
            frac = tf.tf_d - UNITBIT32;
        tf.tf_d = dphase;
            f1 = addr[0];
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
            *out++ = f1 + frac * (f2 - f1);
        tf.tf_i[HIOFFSET] = normhipart;
    }
            frac = tf.tf_d - UNITBIT32;
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif
    return (w+4);
}